

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

void llbuild::buildsystem::BuildSystemInvocation::getUsage(int optionWidth,raw_ostream *os)

{
  raw_ostream *prVar1;
  Options *entry;
  long lVar2;
  format_object_base local_1d8;
  pointer local_1c8;
  int local_1c0;
  Options options [11];
  string local_50;
  
  options[0].option.Data = "--help";
  options[0].option.Length = 6;
  options[0].helpText.Data = "show this help message and exit";
  options[0].helpText.Length = 0x1f;
  options[1].option.Data = "--version";
  options[1].option.Length = 9;
  options[1].helpText.Data = "show the tool version";
  options[1].helpText.Length = 0x15;
  options[2].option.Data = "-C <PATH>, --chdir <PATH>";
  options[2].option.Length = 0x19;
  options[2].helpText.Data = "change directory to PATH before building";
  options[2].helpText.Length = 0x28;
  options[3].option.Data = "--no-db";
  options[3].option.Length = 7;
  options[3].helpText.Data = "disable use of a build database";
  options[3].helpText.Length = 0x1f;
  options[4].option.Data = "--db <PATH>";
  options[4].option.Length = 0xb;
  options[4].helpText.Data = "enable building against the database at PATH";
  options[4].helpText.Length = 0x2c;
  options[5].option.Data = "-f <PATH>";
  options[5].option.Length = 9;
  options[5].helpText.Data = "load the build task file at PATH";
  options[5].helpText.Length = 0x20;
  options[6].option.Data = "--serial";
  options[6].option.Length = 8;
  options[6].helpText.Data = "do not build in parallel";
  options[6].helpText.Length = 0x18;
  options[7].option.Data = "--scheduler <SCHEDULER>";
  options[7].option.Length = 0x17;
  options[7].helpText.Data = "set scheduler algorithm";
  options[7].helpText.Length = 0x17;
  options[8].option.Data = "-j,--jobs <JOBS>";
  options[8].option.Length = 0x10;
  options[8].helpText.Data = "set how many concurrent jobs (lanes) to run";
  options[8].helpText.Length = 0x2b;
  options[9].option.Data = "-v, --verbose";
  options[9].option.Length = 0xd;
  options[9].helpText.Data = "show verbose status information";
  options[9].helpText.Length = 0x1f;
  options[10].option.Data = "--trace <PATH>";
  options[10].option.Length = 0xe;
  options[10].helpText.Data = "trace build engine operation to PATH";
  options[10].helpText.Length = 0x24;
  for (lVar2 = 0; lVar2 != 0x160; lVar2 = lVar2 + 0x20) {
    prVar1 = llvm::raw_ostream::operator<<(os,"  ");
    llvm::StringRef::str_abi_cxx11_(&local_50,(StringRef *)((long)&options[0].option.Data + lVar2));
    local_1d8.Fmt = "%-*s";
    local_1d8._vptr_format_object_base = (_func_int **)&PTR_home_00203210;
    local_1c8 = local_50._M_dataplus._M_p;
    local_1c0 = optionWidth;
    prVar1 = llvm::raw_ostream::operator<<(prVar1,&local_1d8);
    prVar1 = llvm::raw_ostream::operator<<(prVar1," ");
    prVar1 = llvm::raw_ostream::operator<<
                       (prVar1,*(StringRef *)((long)&options[0].helpText.Data + lVar2));
    llvm::raw_ostream::operator<<(prVar1,"\n");
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

void BuildSystemInvocation::getUsage(int optionWidth, raw_ostream& os) {
  const struct Options {
    llvm::StringRef option, helpText;
  } options[] = {
    { "--help", "show this help message and exit" },
    { "--version", "show the tool version" },
    { "-C <PATH>, --chdir <PATH>", "change directory to PATH before building" },
    { "--no-db", "disable use of a build database" },
    { "--db <PATH>", "enable building against the database at PATH" },
    { "-f <PATH>", "load the build task file at PATH" },
    { "--serial", "do not build in parallel" },
    { "--scheduler <SCHEDULER>", "set scheduler algorithm" },
    { "-j,--jobs <JOBS>", "set how many concurrent jobs (lanes) to run" },
    { "-v, --verbose", "show verbose status information" },
    { "--trace <PATH>", "trace build engine operation to PATH" },
  };
  
  for (const auto& entry: options) {
    os << "  " << llvm::format("%-*s", optionWidth, entry.option.str().c_str()) << " "
       << entry.helpText << "\n";
  }
}